

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O3

void combine_pack(player *p)

{
  ushort uVar1;
  object **ppoVar2;
  ulong uVar3;
  _Bool _Var4;
  bool bVar5;
  wchar_t wVar6;
  object *obj;
  ulong uVar7;
  uint16_t uVar8;
  object *obj1;
  ulong uVar9;
  object_stack_t mode;
  object_stack_t mode2;
  wchar_t n_free_slot;
  int local_40;
  int local_3c;
  object *local_38;
  
  obj = pile_last_item(p->gear);
  if (obj == (object *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = false;
    do {
      if (obj->kind == (object_kind *)0x0) {
        __assert_fail("obj1->kind",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                      ,0x4f9,"void combine_pack(struct player *)");
      }
      _Var4 = tval_is_money(obj);
      if (_Var4) {
        __assert_fail("!tval_is_money(obj1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                      ,0x4fa,"void combine_pack(struct player *)");
      }
      local_38 = obj->prev;
      obj1 = p->gear;
      if (obj1 != obj && obj1 != (object *)0x0) {
        do {
          uVar7 = (ulong)z_info->quiver_size;
          if (uVar7 == 0) {
            mode = OSTACK_PACK;
          }
          else {
            ppoVar2 = p->upkeep->quiver;
            if (*ppoVar2 == obj1) {
              mode = OSTACK_QUIVER;
            }
            else {
              uVar3 = 1;
              do {
                uVar9 = uVar3;
                if (uVar7 == uVar9) break;
                uVar3 = uVar9 + 1;
              } while (ppoVar2[uVar9] != obj1);
              mode = OSTACK_PACK;
              if (uVar9 < uVar7) {
                mode = OSTACK_QUIVER;
              }
            }
          }
          if (obj1->kind == (object_kind *)0x0) {
            __assert_fail("obj2->kind",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                          ,0x503,"void combine_pack(struct player *)");
          }
          _Var4 = object_mergeable(obj1,obj,mode);
          if (_Var4) {
            object_absorb(obj1->known,obj->known);
            obj->known = (object *)0x0;
            object_absorb(obj1,obj);
            bVar5 = true;
LAB_00196117:
            obj1->known->number = obj1->number;
            break;
          }
          uVar7 = (ulong)z_info->quiver_size;
          if (uVar7 == 0) {
            mode2 = OSTACK_PACK;
          }
          else {
            ppoVar2 = p->upkeep->quiver;
            if (*ppoVar2 == obj) {
              mode2 = OSTACK_QUIVER;
            }
            else {
              uVar3 = 1;
              do {
                uVar9 = uVar3;
                if (uVar7 == uVar9) break;
                uVar3 = uVar9 + 1;
              } while (ppoVar2[uVar9] != obj);
              mode2 = OSTACK_PACK;
              if (uVar9 < uVar7) {
                mode2 = OSTACK_QUIVER;
              }
            }
          }
          _Var4 = object_stackable(obj1,obj,mode2 | mode);
          if (_Var4) {
            if (mode < OSTACK_QUIVER) {
              if (obj1->kind->base->max_stack != (uint)obj1->number) goto LAB_001960e3;
            }
            else {
              uVar1 = z_info->quiver_slot_size;
              _Var4 = tval_is_ammo(obj1);
              uVar8 = 1;
              if (!_Var4) {
                uVar8 = z_info->thrown_quiver_mult;
              }
              if (uVar1 / uVar8 != (ushort)obj1->number) {
                if ((mode2 & OSTACK_PACK) != OSTACK_NONE) {
                  uVar1 = z_info->pack_size;
                  wVar6 = pack_slots_used(p);
                  local_3c = (uint)uVar1 - wVar6;
                  quiver_absorb_num(p,obj,&local_3c,&local_40);
                  if (local_40 < 1) goto LAB_001960a4;
                }
LAB_001960e3:
                object_absorb_partial(obj1->known,obj->known,mode,mode2);
                object_absorb_partial(obj1,obj,mode,mode2);
                obj1->known->number = obj1->number;
                obj1 = obj;
                goto LAB_00196117;
              }
            }
          }
LAB_001960a4:
          obj1 = obj1->next;
          if ((obj1 == (object *)0x0) || (obj1 == obj)) break;
        } while( true );
      }
      obj = local_38;
    } while (local_38 != (object *)0x0);
  }
  calc_inventory(p);
  event_signal(EVENT_INVENTORY);
  event_signal(EVENT_EQUIPMENT);
  if ((bVar5) && (msg("You combine some items in your pack."), bVar5)) {
    cmd_disable_repeat();
    return;
  }
  return;
}

Assistant:

void combine_pack(struct player *p)
{
	struct object *obj1, *obj2, *prev;
	bool display_message = false;
	bool disable_repeat = false;

	/* Combine the pack (backwards) */
	obj1 = gear_last_item(p);
	while (obj1) {
		assert(obj1->kind);
		assert(!tval_is_money(obj1));
		prev = obj1->prev;

		/* Scan the items above that item */
		for (obj2 = p->gear; obj2 && obj2 != obj1; obj2 = obj2->next) {
			object_stack_t stack_mode2 =
				object_is_in_quiver(p, obj2) ?
				OSTACK_QUIVER : OSTACK_PACK;

			assert(obj2->kind);

			/* Can we drop "obj1" onto "obj2"? */
			if (object_mergeable(obj2, obj1, stack_mode2)) {
				display_message = true;
				disable_repeat = true;
				object_absorb(obj2->known, obj1->known);
				obj1->known = NULL;
				object_absorb(obj2, obj1);

				/* Ensure numbers align (should not be necessary, but safer) */
				obj2->known->number = obj2->number;

				break;
			} else {
				object_stack_t stack_mode1 =
					object_is_in_quiver(p, obj1) ?
					OSTACK_QUIVER : OSTACK_PACK;

				if (inven_can_stack_partial(p, obj2, obj1,
						stack_mode2, stack_mode1)) {
					/*
					 * Don't display a message for this
					 * case:  shuffling items between
					 * stacks isn't interesting to the
					 * player.
					 */
					object_absorb_partial(obj2->known,
						obj1->known, stack_mode2,
						stack_mode1);
					object_absorb_partial(obj2, obj1,
						stack_mode2, stack_mode1);
					/*
					 * Ensure numbers align (should not be
					 * necessary, but safer)
					 */
					obj2->known->number = obj2->number;
					obj1->known->number = obj1->number;

					break;
				}
			}
		}
		obj1 = prev;
	}

	calc_inventory(p);

	/* Redraw gear */
	event_signal(EVENT_INVENTORY);
	event_signal(EVENT_EQUIPMENT);

	/* Message */
	if (display_message) {
		msg("You combine some items in your pack.");

		/*
		 * Stop "repeat last command" from working if a stack was
		 * completely combined with another.
		 */
		if (disable_repeat) cmd_disable_repeat();
	}
}